

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_NewClass1(JSRuntime *rt,JSClassID class_id,JSClassDef *class_def,JSAtom name)

{
  int iVar1;
  JSAtom JVar2;
  void *pvVar3;
  long *plVar4;
  uint *puVar5;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  JSValue *new_tab;
  JSContext *ctx;
  list_head *el;
  JSClass *new_class_array;
  JSClass *cl;
  int i;
  int new_size;
  undefined4 in_stack_ffffffffffffff98;
  JSAtom in_stack_ffffffffffffff9c;
  JSRuntime *in_stack_ffffffffffffffa0;
  long local_48;
  int local_2c;
  int local_4;
  
  if (in_ESI < 0x10000) {
    if ((in_ESI < *(uint *)(in_RDI + 0x6c)) &&
       (*(int *)(*(long *)(in_RDI + 0x70) + (ulong)in_ESI * 0x28) != 0)) {
      local_4 = -1;
    }
    else {
      if (*(uint *)(in_RDI + 0x6c) <= in_ESI) {
        iVar1 = max_int(in_ESI + 1,(*(int *)(in_RDI + 0x6c) * 3) / 2);
        iVar1 = max_int(0x33,iVar1);
        for (local_48 = *(long *)(in_RDI + 0x80); local_48 != in_RDI + 0x78;
            local_48 = *(long *)(local_48 + 8)) {
          pvVar3 = js_realloc_rt(in_stack_ffffffffffffffa0,
                                 (void *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98),0x1221e4);
          if (pvVar3 == (void *)0x0) {
            return -1;
          }
          for (local_2c = *(int *)(in_RDI + 0x6c); local_2c < iVar1; local_2c = local_2c + 1) {
            plVar4 = (long *)((long)pvVar3 + (long)local_2c * 0x10);
            in_stack_ffffffffffffff98 = 0;
            in_stack_ffffffffffffffa0 = (JSRuntime *)0x2;
            *plVar4 = (ulong)in_stack_ffffffffffffff9c << 0x20;
            plVar4[1] = 2;
          }
          *(void **)(local_48 + 0x20) = pvVar3;
        }
        pvVar3 = js_realloc_rt(in_stack_ffffffffffffffa0,
                               (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                               ,0x12228f);
        if (pvVar3 == (void *)0x0) {
          return -1;
        }
        memset((void *)((long)pvVar3 + (long)*(int *)(in_RDI + 0x6c) * 0x28),0,
               (long)(iVar1 - *(int *)(in_RDI + 0x6c)) * 0x28);
        *(void **)(in_RDI + 0x70) = pvVar3;
        *(int *)(in_RDI + 0x6c) = iVar1;
      }
      puVar5 = (uint *)(*(long *)(in_RDI + 0x70) + (ulong)in_ESI * 0x28);
      *puVar5 = in_ESI;
      JVar2 = JS_DupAtomRT(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      puVar5[1] = JVar2;
      *(undefined8 *)(puVar5 + 2) = *(undefined8 *)(in_RDX + 8);
      *(undefined8 *)(puVar5 + 4) = *(undefined8 *)(in_RDX + 0x10);
      *(undefined8 *)(puVar5 + 6) = *(undefined8 *)(in_RDX + 0x18);
      *(undefined8 *)(puVar5 + 8) = *(undefined8 *)(in_RDX + 0x20);
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int JS_NewClass1(JSRuntime *rt, JSClassID class_id,
                        const JSClassDef *class_def, JSAtom name)
{
    int new_size, i;
    JSClass *cl, *new_class_array;
    struct list_head *el;

    if (class_id >= (1 << 16))
        return -1;
    if (class_id < rt->class_count &&
        rt->class_array[class_id].class_id != 0)
        return -1;

    if (class_id >= rt->class_count) {
        new_size = max_int(JS_CLASS_INIT_COUNT,
                           max_int(class_id + 1, rt->class_count * 3 / 2));

        /* reallocate the context class prototype array, if any */
        list_for_each(el, &rt->context_list) {
            JSContext *ctx = list_entry(el, JSContext, link);
            JSValue *new_tab;
            new_tab = js_realloc_rt(rt, ctx->class_proto,
                                    sizeof(ctx->class_proto[0]) * new_size);
            if (!new_tab)
                return -1;
            for(i = rt->class_count; i < new_size; i++)
                new_tab[i] = JS_NULL;
            ctx->class_proto = new_tab;
        }
        /* reallocate the class array */
        new_class_array = js_realloc_rt(rt, rt->class_array,
                                        sizeof(JSClass) * new_size);
        if (!new_class_array)
            return -1;
        memset(new_class_array + rt->class_count, 0,
               (new_size - rt->class_count) * sizeof(JSClass));
        rt->class_array = new_class_array;
        rt->class_count = new_size;
    }
    cl = &rt->class_array[class_id];
    cl->class_id = class_id;
    cl->class_name = JS_DupAtomRT(rt, name);
    cl->finalizer = class_def->finalizer;
    cl->gc_mark = class_def->gc_mark;
    cl->call = class_def->call;
    cl->exotic = class_def->exotic;
    return 0;
}